

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::nextRaw(Preprocessor *this)

{
  Token *pTVar1;
  size_type sVar2;
  BumpAllocator *alloc;
  Token TVar3;
  int iVar4;
  SourceLocation SVar5;
  undefined4 extraout_var;
  __extent_storage<18446744073709551615UL> src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  Trivia TVar7;
  SourceRange SVar8;
  Token TVar9;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  Token local_e0;
  Token local_d0;
  SmallVectorBase<slang::parsing::Trivia> local_c0 [3];
  
  if ((this->currentToken).info == (Info *)0x0) {
    pTVar1 = this->currentMacroToken;
    if (pTVar1 == (Token *)0x0) {
      local_e0 = Lexer::lex((Lexer *)(this->lexerStack).
                                     super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                     .data_[(this->lexerStack).
                                            super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                            .len - 1]._M_t.
                                     super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                     .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,
                            (this->keywordVersionStack).
                            super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]);
      TVar9 = local_e0;
      if (local_e0.kind == EndOfFile) {
        popSource(this);
        if ((this->lexerStack).
            super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
            .len == 0) {
          sVar2 = (this->branchStack).
                  super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len;
          TVar9 = local_e0;
          if (sVar2 != 0) {
            SVar8 = Token::range(&(this->branchStack).
                                  super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
                                  data_[sVar2 - 1].directive);
            Diagnostics::add(this->diagnostics,(DiagCode)0x130004,SVar8);
            TVar9 = local_e0;
          }
        }
        else {
          local_c0[0].len = 0;
          local_c0[0].cap = 8;
          local_d0 = local_e0;
          local_c0[0].data_ = (pointer)local_c0[0].firstElement;
          sVar6 = Token::trivia(&local_d0);
          SmallVectorBase<slang::parsing::Trivia>::
          append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                    (local_c0,sVar6._M_ptr,
                     sVar6._M_ptr + sVar6._M_extent._M_extent_value._M_extent_value);
          SVar5 = Token::location(&local_d0);
          sVar6 = Token::trivia(&local_d0);
          if (sVar6._M_extent._M_extent_value._M_extent_value != 0) {
            TVar7 = Trivia::withLocation
                              (local_c0[0].data_ + (local_c0[0].len - 1),this->alloc,SVar5);
            local_c0[0].data_[local_c0[0].len - 1].field_0.rawText.ptr = TVar7.field_0._0_8_;
            local_c0[0].data_[local_c0[0].len - 1].field_0.rawText.len = TVar7.field_0._8_4_;
            local_c0[0].data_[local_c0[0].len - 1].hasFullLocation = (bool)(char)TVar7._12_2_;
            local_c0[0].data_[local_c0[0].len - 1].kind = (char)((ushort)TVar7._12_2_ >> 8);
          }
          do {
            local_e0 = Lexer::lex((Lexer *)(this->lexerStack).
                                           super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                           .data_[(this->lexerStack).
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .len - 1]._M_t.
                                           super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                           .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,
                                  (this->keywordVersionStack).
                                  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1]);
            local_d0 = local_e0;
            sVar6 = Token::trivia(&local_d0);
            SmallVectorBase<slang::parsing::Trivia>::
            append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                      (local_c0,sVar6._M_ptr,
                       sVar6._M_ptr + sVar6._M_extent._M_extent_value._M_extent_value);
            SVar5 = Token::location(&local_d0);
            sVar6 = Token::trivia(&local_d0);
            src = sVar6._M_extent._M_extent_value;
            if ((EVP_PKEY_CTX *)src._M_extent_value != (EVP_PKEY_CTX *)0x0) {
              TVar7 = Trivia::withLocation
                                (local_c0[0].data_ + (local_c0[0].len - 1),this->alloc,SVar5);
              local_c0[0].data_[local_c0[0].len - 1].field_0.rawText.ptr = TVar7.field_0._0_8_;
              local_c0[0].data_[local_c0[0].len - 1].field_0.rawText.len = TVar7.field_0._8_4_;
              src._M_extent_value = TVar7._8_8_ >> 0x20;
              local_c0[0].data_[local_c0[0].len - 1].hasFullLocation = (bool)(char)TVar7._12_2_;
              local_c0[0].data_[local_c0[0].len - 1].kind = (char)((ushort)TVar7._12_2_ >> 8);
            }
            if (local_e0.kind != EndOfFile) goto LAB_002899b7;
            popSource(this);
          } while ((this->lexerStack).
                   super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                   .len != 0);
          sVar2 = (this->branchStack).
                  super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len;
          src._M_extent_value = (size_t)extraout_RDX;
          if (sVar2 != 0) {
            SVar8 = Token::range(&(this->branchStack).
                                  super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
                                  data_[sVar2 - 1].directive);
            Diagnostics::add(this->diagnostics,(DiagCode)0x130004,SVar8);
            src._M_extent_value = (size_t)extraout_RDX_00;
          }
LAB_002899b7:
          if ((local_c0[0].len == 0) || (local_c0[0].data_[local_c0[0].len - 1].kind != EndOfLine))
          {
            Trivia::Trivia((Trivia *)&local_d0,EndOfLine,(string_view)(ZEXT816(0x4ffe75) << 0x40));
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      (local_c0,(Trivia *)&local_d0);
            src._M_extent_value = (size_t)extraout_RDX_01;
          }
          alloc = this->alloc;
          iVar4 = SmallVectorBase<slang::parsing::Trivia>::copy
                            (local_c0,(EVP_PKEY_CTX *)alloc,(EVP_PKEY_CTX *)src._M_extent_value);
          sVar6._M_ptr._4_4_ = extraout_var;
          sVar6._M_ptr._0_4_ = iVar4;
          sVar6._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
          TVar9 = Token::withTrivia(&local_e0,alloc,sVar6);
          if (local_c0[0].data_ != (pointer)local_c0[0].firstElement) {
            operator_delete(local_c0[0].data_);
          }
        }
      }
    }
    else {
      TVar3 = *pTVar1;
      TVar9 = *pTVar1;
      this->currentMacroToken = pTVar1 + 1;
      if (pTVar1 + 1 ==
          (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ +
          (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len) {
        this->currentMacroToken = (Token *)0x0;
        (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
        TVar9 = TVar3;
      }
    }
  }
  else {
    Token::Token((Token *)local_c0);
    TVar9 = this->currentToken;
    *(pointer *)&this->currentToken = local_c0[0].data_;
    (this->currentToken).info = (Info *)local_c0[0].len;
  }
  return TVar9;
}

Assistant:

Token Preprocessor::nextRaw() {
    // it's possible we have a token buffered from looking ahead when handling a directive
    if (currentToken)
        return std::exchange(currentToken, Token());

    // if we just expanded a macro we'll have tokens from that to return
    if (currentMacroToken) {
        auto result = *currentMacroToken;
        currentMacroToken++;
        if (currentMacroToken == expandedTokens.end()) {
            currentMacroToken = nullptr;
            expandedTokens.clear();
        }
        return result;
    }

    // if this assert fires, the user disregarded an EoF and kept calling next()
    SLANG_ASSERT(!lexerStack.empty());

    // Pull the next token from the active source.
    // This is the common case.
    auto& source = lexerStack.back();
    auto token = source->lex(keywordVersionStack.back());
    if (token.kind != TokenKind::EndOfFile)
        return token;

    auto checkBranchStack = [&] {
        if (!branchStack.empty())
            addDiag(diag::MissingEndIfDirective, branchStack.back().directive.range());
    };

    // don't return EndOfFile tokens for included files, fall
    // through to loop to merge trivia
    popSource();
    if (lexerStack.empty()) {
        checkBranchStack();
        return token;
    }

    // Rare case: we have an EoF from an include file... we don't want to return
    // that one, but we do want to merge its trivia with whatever comes next.
    SmallVector<Trivia, 8> trivia;
    auto appendTrivia = [&trivia, this](Token token) {
        trivia.append_range(token.trivia());
        SourceLocation loc = token.location();
        if (!token.trivia().empty())
            trivia.back() = trivia.back().withLocation(alloc, loc);
    };

    appendTrivia(token);

    while (true) {
        auto& nextSource = lexerStack.back();
        token = nextSource->lex(keywordVersionStack.back());
        appendTrivia(token);
        if (token.kind != TokenKind::EndOfFile)
            break;

        popSource();
        if (lexerStack.empty()) {
            checkBranchStack();
            break;
        }
    }

    // Ensure EoL at the end of trivia to prevent inlining issues
    if (trivia.empty() || trivia.back().kind != TriviaKind::EndOfLine)
        trivia.push_back(Trivia(TriviaKind::EndOfLine, ""sv));

    // finally found a real token to return, so update trivia and get out of here
    return token.withTrivia(alloc, trivia.copy(alloc));
}